

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generation_iterator.cpp
# Opt level: O3

generation_iterator * __thiscall pstore::generation_iterator::operator++(generation_iterator *this)

{
  typed_address<pstore::trailer> pos;
  _func_int **local_20;
  unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  local_18;
  
  database::getro<pstore::trailer,void>
            ((database *)&stack0xffffffffffffffe0,(typed_address<pstore::trailer>)this->db_,
             (this->pos_).a_.a_);
  pos.a_.a_ = (address)local_20[4];
  (this->pos_).a_.a_ = (value_type)pos.a_.a_;
  if ((tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       )local_18._M_t.
        super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_18._M_t.
               super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl)
    ;
    pos.a_.a_ = (address)(this->pos_).a_.a_;
  }
  trailer::validate(this->db_,pos);
  return this;
}

Assistant:

generation_iterator & generation_iterator::operator++ () {
        pos_ = db_->getro<pstore::trailer> (pos_)->a.prev_generation;
        this->validate ();
        return *this;
    }